

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParsePubidLiteral(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  xmlParserInputPtr pxVar3;
  byte *pbVar4;
  xmlChar *pxVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  bool bVar12;
  xmlChar *local_40;
  
  xVar2 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar3 = ctxt->input;
    if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
       ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar10 = *ctxt->input->cur;
  if (bVar10 != 0x22) {
    if (bVar10 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    bVar10 = 0x27;
  }
  xmlNextChar(ctxt);
  local_40 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (local_40 == (xmlChar *)0x0) {
    local_40 = (xmlChar *)0x0;
    xmlErrMemory(ctxt,(char *)0x0);
  }
  else {
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    bVar1 = *ctxt->input->cur;
    uVar8 = (ulong)bVar1;
    uVar6 = 0;
    bVar12 = bVar10 != bVar1;
    if ((bVar12) && (""[uVar8] != '\0')) {
      iVar11 = 100;
      iVar9 = 0;
      uVar7 = 0;
      do {
        uVar6 = uVar7 + 1;
        if ((long)iVar11 <= (long)uVar6) {
          if ((iVar11 < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
            iVar11 = iVar11 * 2;
            pxVar5 = (xmlChar *)(*xmlRealloc)(local_40,(long)iVar11);
            if (pxVar5 == (xmlChar *)0x0) {
              xmlErrMemory(ctxt,(char *)0x0);
              goto LAB_0015e657;
            }
            bVar12 = true;
            local_40 = pxVar5;
          }
          else {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Public ID");
LAB_0015e657:
            (*xmlFree)(local_40);
            bVar12 = false;
          }
          if (!bVar12) {
            return (xmlChar *)0x0;
          }
        }
        local_40[uVar7] = (xmlChar)uVar8;
        if (iVar9 < 0x32) {
          iVar9 = iVar9 + 1;
        }
        else {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa))
          {
            xmlGROW(ctxt);
          }
          iVar9 = 0;
          if (ctxt->instate == XML_PARSER_EOF) {
            (*xmlFree)(local_40);
            return (xmlChar *)0x0;
          }
        }
        xmlNextChar(ctxt);
        pbVar4 = ctxt->input->cur;
        bVar1 = *pbVar4;
        if (bVar1 == 0) {
          if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)pbVar4 < 0xfa)) {
            xmlGROW(ctxt);
          }
          if (ctxt->progressive == 0) {
            pxVar3 = ctxt->input;
            if ((500 < (long)pxVar3->cur - (long)pxVar3->base) &&
               ((long)pxVar3->end - (long)pxVar3->cur < 500)) {
              xmlSHRINK(ctxt);
            }
          }
          bVar1 = *ctxt->input->cur;
        }
        uVar8 = (ulong)bVar1;
        bVar12 = bVar10 != bVar1;
      } while ((bVar12) && (uVar7 = uVar6, ""[uVar8] != '\0'));
      uVar6 = uVar6 & 0xffffffff;
    }
    local_40[uVar6] = '\0';
    if (bVar12) {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
    }
    else {
      xmlNextChar(ctxt);
    }
    ctxt->instate = xVar2;
  }
  return local_40;
}

Assistant:

xmlChar *
xmlParsePubidLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    xmlChar cur;
    xmlChar stop;
    int count = 0;
    xmlParserInputState oldstate = ctxt->instate;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    cur = CUR;
    while ((IS_PUBIDCHAR_CH(cur)) && (cur != stop)) { /* checked */
	if (len + 1 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Public ID");
                xmlFree(buf);
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return(NULL);
            }
	}
	NEXT;
	cur = CUR;
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR;
	}
    }
    buf[len] = 0;
    if (cur != stop) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    ctxt->instate = oldstate;
    return(buf);
}